

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O2

optional<int32_t> __thiscall
Commands::find_constant(Commands *this,string_view *value,bool context_free_only)

{
  _Rb_tree_node_base *p_Var1;
  char in_CL;
  
  p_Var1 = (_Rb_tree_node_base *)value[10].__size;
  while( true ) {
    if (p_Var1 == (_Rb_tree_node_base *)&value[9].__size) {
      *(undefined1 *)&(this->commands)._M_t._M_impl = 0;
      (this->commands)._M_t._M_impl.field_0x4 = 0;
      return (optional<int32_t>)(OptionalBase<int>)this;
    }
    if ((*(char *)&(*(string_view **)(p_Var1 + 2))[3].__data == in_CL) &&
       (Enum::find((Enum *)this,*(string_view **)(p_Var1 + 2)),
       *(char *)&(this->commands)._M_t._M_impl != '\0')) break;
    p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
  }
  return (optional<int32_t>)(OptionalBase<int>)this;
}

Assistant:

optional<int32_t> Commands::find_constant(const string_view& value, bool context_free_only) const
{
    for(auto& enum_pair : enums)
    {
        if(enum_pair.second->is_global == context_free_only)
        {
            if(auto opt = enum_pair.second->find(value))
                return opt;
        }
    }
    return nullopt;
}